

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chart.cpp
# Opt level: O2

string * __thiscall
Chart::renderSubTotal(string *__return_storage_ptr__,Chart *this,time_t total_work,string *padding)

{
  ostream *poVar1;
  allocator<char> local_21a;
  allocator<char> local_219;
  Color local_218;
  string local_210;
  string local_1f0;
  string local_1d0;
  stringstream out;
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&out);
  poVar1 = std::operator<<(local_1a0,(string *)padding);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"underline",&local_219);
  Color::Color(&local_218,&local_1f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"      ",&local_21a);
  Color::colorize(&local_1d0,&local_218,&local_210);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,(string *)padding);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 3;
  poVar1 = std::operator<<(poVar1,0x20);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)(total_work / 0xe10));
  poVar1 = std::operator<<(poVar1,':');
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = std::operator<<(poVar1,0x30);
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(int)(short)((short)(total_work % 0xe10) / 0x3c));
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

std::string Chart::renderSubTotal (
  time_t total_work,
  const std::string& padding)
{
  std::stringstream out;

  int hours = total_work / 3600;
  int minutes = (total_work % 3600) / 60;

  out << padding
      << Color ("underline").colorize ("      ")
      << '\n'
      << padding
      << std::setw (3) << std::setfill (' ') << hours
      << ':'
      << std::setw (2) << std::setfill ('0') << minutes
      << '\n';

  return out.str ();
}